

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int tinyexr::InitTileOffsets
              (OffsetData *offset_data,EXRHeader *exr_header,
              vector<int,_std::allocator<int>_> *num_x_tiles,
              vector<int,_std::allocator<int>_> *num_y_tiles)

{
  int iVar1;
  pointer pvVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  pointer pvVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  long local_48;
  
  iVar1 = (int)((ulong)((long)(num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  offset_data->num_x_levels = iVar1;
  iVar3 = (int)((ulong)((long)(num_y_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(num_y_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  offset_data->num_y_levels = iVar3;
  iVar5 = 0;
  iVar6 = iVar5;
  if ((uint)exr_header < 2) {
    iVar6 = 0;
    if (iVar1 == iVar3) {
      std::
      vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::resize(&offset_data->offsets,(long)iVar1);
      pvVar9 = (offset_data->offsets).
               super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar6 = iVar5;
      if ((offset_data->offsets).
          super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pvVar9) {
        uVar11 = 0;
        iVar6 = 0;
        do {
          std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::resize(pvVar9 + uVar11,
                   (long)(num_y_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar11]);
          pvVar9 = (offset_data->offsets).
                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar2 = pvVar9[uVar11].
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (pvVar9[uVar11].
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != pvVar2) {
            iVar1 = (num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar11];
            uVar7 = 0;
            uVar4 = 1;
            do {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                        (pvVar2 + uVar7,(long)iVar1);
              iVar1 = (num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar11];
              iVar6 = iVar6 + iVar1;
              pvVar9 = (offset_data->offsets).
                       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar2 = pvVar9[uVar11].
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar7 = ((long)pvVar9[uVar11].
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                      -0x5555555555555555;
              bVar12 = uVar4 <= uVar7;
              lVar8 = uVar7 - uVar4;
              uVar7 = uVar4;
              uVar4 = (ulong)((int)uVar4 + 1);
            } while (bVar12 && lVar8 != 0);
          }
          uVar11 = (ulong)((int)uVar11 + 1);
          uVar7 = ((long)(offset_data->offsets).
                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9 >> 3) *
                  -0x5555555555555555;
        } while (uVar11 <= uVar7 && uVar7 - uVar11 != 0);
      }
    }
  }
  else if ((uint)exr_header == 2) {
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::resize(&offset_data->offsets,(long)iVar3 * (long)iVar1);
    iVar1 = offset_data->num_y_levels;
    if (0 < iVar1) {
      uVar11 = (ulong)(uint)offset_data->num_x_levels;
      local_48 = 0;
      iVar6 = 0;
      do {
        if (0 < (int)uVar11) {
          pvVar9 = (offset_data->offsets).
                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar8 = 0;
          do {
            iVar1 = (int)uVar11 * (int)local_48 + (int)lVar8;
            std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::resize(pvVar9 + iVar1,
                     (long)(num_y_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[local_48]);
            pvVar9 = (offset_data->offsets).
                     super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pvVar2 = *(pointer *)
                      &pvVar9[iVar1].
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl;
            if (*(pointer *)
                 ((long)&pvVar9[iVar1].
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl + 8) != pvVar2) {
              iVar3 = (num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar8];
              lVar10 = 0;
              uVar11 = 0;
              do {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           ((long)&(pvVar2->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl + lVar10),(long)iVar3);
                iVar3 = (num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar8];
                iVar6 = iVar6 + iVar3;
                uVar11 = uVar11 + 1;
                pvVar9 = (offset_data->offsets).
                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pvVar2 = *(pointer *)
                          &pvVar9[iVar1].
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl;
                lVar10 = lVar10 + 0x18;
              } while (uVar11 < (ulong)(((long)*(pointer *)
                                                ((long)&pvVar9[iVar1].
                                                                                                                
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl + 8) - (long)pvVar2 >> 3) *
                                       -0x5555555555555555));
            }
            lVar8 = lVar8 + 1;
            uVar11 = (ulong)offset_data->num_x_levels;
          } while (lVar8 < (long)uVar11);
          iVar1 = offset_data->num_y_levels;
        }
        local_48 = local_48 + 1;
      } while (local_48 < iVar1);
    }
  }
  return iVar6;
}

Assistant:

static int InitTileOffsets(OffsetData& offset_data,
  const EXRHeader* exr_header,
  const std::vector<int>& num_x_tiles,
  const std::vector<int>& num_y_tiles) {
  int num_tile_blocks = 0;
  offset_data.num_x_levels = static_cast<int>(num_x_tiles.size());
  offset_data.num_y_levels = static_cast<int>(num_y_tiles.size());
  switch (exr_header->tile_level_mode) {
  case TINYEXR_TILE_ONE_LEVEL:
  case TINYEXR_TILE_MIPMAP_LEVELS:
    TINYEXR_CHECK_AND_RETURN_C(offset_data.num_x_levels == offset_data.num_y_levels, 0);
    offset_data.offsets.resize(size_t(offset_data.num_x_levels));

    for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
      offset_data.offsets[l].resize(size_t(num_y_tiles[l]));

      for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
        offset_data.offsets[l][dy].resize(size_t(num_x_tiles[l]));
        num_tile_blocks += num_x_tiles[l];
      }
    }
    break;

  case TINYEXR_TILE_RIPMAP_LEVELS:

    offset_data.offsets.resize(static_cast<size_t>(offset_data.num_x_levels) * static_cast<size_t>(offset_data.num_y_levels));

    for (int ly = 0; ly < offset_data.num_y_levels; ++ly) {
      for (int lx = 0; lx < offset_data.num_x_levels; ++lx) {
        int l = ly * offset_data.num_x_levels + lx;
        offset_data.offsets[size_t(l)].resize(size_t(num_y_tiles[size_t(ly)]));

        for (size_t dy = 0; dy < offset_data.offsets[size_t(l)].size(); ++dy) {
          offset_data.offsets[size_t(l)][dy].resize(size_t(num_x_tiles[size_t(lx)]));
          num_tile_blocks += num_x_tiles[size_t(lx)];
        }
      }
    }
    break;

  default:
    return 0;
  }
  return num_tile_blocks;
}